

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void upb_inttable_removeiter(upb_inttable *t,intptr_t *iter)

{
  upb_tabent *puVar1;
  byte bVar2;
  ulong uVar3;
  upb_tabent *puVar4;
  long lVar5;
  
  uVar3 = *iter;
  if (uVar3 < t->array_size) {
    t->array_count = t->array_count - 1;
    t->array[uVar3].val = 0xffffffffffffffff;
    return;
  }
  puVar4 = (t->t).entries;
  puVar1 = puVar4 + (uVar3 - t->array_size);
  bVar2 = (t->t).size_lg2;
  if (bVar2 != 0) {
    lVar5 = 0;
    do {
      if (*(upb_tabent **)((long)&puVar4->next + lVar5) == puVar1) {
        *(_upb_tabent **)((long)&puVar4->next + lVar5) = puVar1->next;
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while ((long)(1 << (bVar2 & 0x1f)) * 0x18 != lVar5);
  }
  (t->t).count = (t->t).count - 1;
  puVar1->key = 0;
  puVar1->next = (_upb_tabent *)0x0;
  return;
}

Assistant:

void upb_inttable_removeiter(upb_inttable* t, intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)i < t->array_size) {
    t->array_count--;
    mutable_array(t)[i].val = -1;
  } else {
    upb_tabent* ent = &t->t.entries[i - t->array_size];
    upb_tabent* prev = NULL;

    // Linear search, not great.
    upb_tabent* end = &t->t.entries[upb_table_size(&t->t)];
    for (upb_tabent* e = t->t.entries; e != end; e++) {
      if (e->next == ent) {
        prev = e;
        break;
      }
    }

    if (prev) {
      prev->next = ent->next;
    }

    t->t.count--;
    ent->key = 0;
    ent->next = NULL;
  }
}